

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

bool CorUnix::CPalSynchronizationManager::HasProcessExited
               (DWORD dwPid,DWORD *pdwExitCode,bool *pfIsActualExitCode)

{
  DWORD DVar1;
  int iVar2;
  int *piVar3;
  DWORD DVar4;
  uint local_3c;
  bool *pbStack_38;
  int iStatus;
  
  if (PAL_InitializeChakraCoreCalled) {
    DVar4 = 1;
    pbStack_38 = pfIsActualExitCode;
    do {
      DVar1 = waitpid(dwPid,(int *)&local_3c,1);
      if (DVar1 == dwPid) {
        if ((local_3c & 0x7f) == 0) {
          *pdwExitCode = local_3c >> 8 & 0xff;
          *pbStack_38 = true;
          if (PAL_InitializeChakraCoreCalled != false) {
            return true;
          }
        }
        else if (PAL_InitializeChakraCoreCalled != false) {
          *pbStack_38 = true;
          *pdwExitCode = 1;
          return true;
        }
        break;
      }
      if (DVar1 == 0) {
        if (PAL_InitializeChakraCoreCalled != false) {
          return false;
        }
        break;
      }
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      if (iVar2 != 4) {
        if (iVar2 != 10) {
          if (PAL_InitializeChakraCoreCalled != false) {
            strerror(iVar2);
            return false;
          }
          break;
        }
        if (PAL_InitializeChakraCoreCalled == false) break;
        iVar2 = kill(dwPid,0);
        if (iVar2 == 0) {
          return false;
        }
        if (*piVar3 == 3) {
          DVar4 = 0;
          if (PAL_InitializeChakraCoreCalled == false) break;
        }
        else {
          if (PAL_InitializeChakraCoreCalled == false) break;
          strerror(*piVar3);
        }
        *pbStack_38 = false;
        *pdwExitCode = DVar4;
        return true;
      }
    } while (PAL_InitializeChakraCoreCalled != false);
  }
  abort();
}

Assistant:

bool CPalSynchronizationManager::HasProcessExited(
        DWORD dwPid,
        DWORD * pdwExitCode,
        bool * pfIsActualExitCode)
    {
        pid_t pidWaitRetval;
        int iStatus;
        bool fRet = false;

        TRACE("Looking for status of process; trying wait()\n");

        while(1)
        {
            /* try to get state of process, using non-blocking call */
            pidWaitRetval = waitpid(dwPid, &iStatus, WNOHANG);

            if ((DWORD)pidWaitRetval == dwPid)
            {
                /* success; get the exit code */
                if (WIFEXITED(iStatus))
                {
                    *pdwExitCode = WEXITSTATUS(iStatus);
                    *pfIsActualExitCode = true;
                    TRACE("Exit code was %d\n", *pdwExitCode);
                }
                else
                {
                    WARN("Process terminated without exiting; can't get exit "
                         "code. Assuming EXIT_FAILURE.\n");
                    *pfIsActualExitCode = true;
                    *pdwExitCode = EXIT_FAILURE;
                }

                fRet = true;
            }
            else if (0 == pidWaitRetval)
            {
                // The process is still running.
                TRACE("Process %#x is still active.\n", dwPid);
            }
            else
            {
                // A legitimate cause of failure is EINTR; if this happens we
                // have to try again. A second legitimate cause is ECHILD, which
                // happens if we're trying to retrieve the status of a currently-
                // running process that isn't a child of this process.
                if(EINTR == errno)
                {
                    TRACE("waitpid() failed with EINTR; re-waiting\n");
                    continue;
                }
                else if (ECHILD == errno)
                {
                    TRACE("waitpid() failed with ECHILD; calling kill instead\n");
                    if (kill(dwPid, 0) != 0)
                    {
                        if(ESRCH == errno)
                        {
                            WARN("kill() failed with ESRCH, i.e. target "
                                 "process exited and it wasn't a child, "
                                 "so can't get the exit code, assuming  "
                                 "it was 0.\n");
                            *pfIsActualExitCode = false;
                            *pdwExitCode = 0;
                        }
                        else
                        {
                            ERROR("kill(pid, 0) failed; errno is %d (%s)\n",
                                  errno, strerror(errno));
                            *pfIsActualExitCode = false;
                            *pdwExitCode = EXIT_FAILURE;
                        }

                        fRet = true;
                    }
                }
                else
                {
                    // Ignoring unexpected waitpid errno and assuming that
                    // the process is still running
                    ERROR("waitpid(pid=%u) failed with errno=%d (%s)\n",
                          dwPid, errno, strerror(errno));
                }
            }

            // Break out of the loop in all cases except EINTR.
            break;
        }

        return fRet;
    }